

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O2

int iemgui_compatible_colorarg(int index,int argc,t_atom *argv)

{
  uint uVar1;
  int iVar2;
  t_float tVar3;
  
  uVar1 = 0;
  if (index < argc && -1 < index) {
    if (argv[(uint)index].a_type != A_FLOAT) {
      iVar2 = iemgui_getcolorarg(index,argc,argv);
      return iVar2;
    }
    tVar3 = atom_getfloatarg(index,argc,argv);
    uVar1 = (uint)tVar3;
    if ((int)uVar1 < 0) {
      uVar1 = ~uVar1 & 0xffffff;
    }
    else {
      uVar1 = iemgui_modulo_color(uVar1);
      uVar1 = iemgui_color_hex[uVar1];
    }
  }
  return uVar1;
}

Assistant:

int iemgui_compatible_colorarg(int index, int argc, t_atom* argv)
{
    if (index < 0 || index >= argc)
        return 0;
    if(IS_A_FLOAT(argv,index))
        {
            int col=atom_getfloatarg(index, argc, argv);
            if(col >= 0)
            {
                int idx = iemgui_modulo_color(col);
                return(iemgui_color_hex[(idx)]);
            }
            else
               return((-1 -col)&0xffffff);
        }
    return iemgui_getcolorarg(index, argc, argv);
}